

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool op_mlal(DisasContext_conflict1 *s,arg_s_rrrr *a,_Bool uns,_Bool add)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_i32 rl;
  TCGv_i32 rh;
  TCGv_i32 bl;
  TCGv_i32 bh;
  TCGv_i32 t3;
  TCGv_i32 t2;
  TCGv_i32 t1;
  TCGv_i32 t0;
  TCGContext_conflict1 *tcg_ctx;
  _Bool add_local;
  _Bool uns_local;
  arg_s_rrrr *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  rl = load_reg(s,a->rm);
  rh = load_reg(s,a->rn);
  if (uns) {
    tcg_gen_mulu2_i32_aarch64(tcg_ctx_00,rl,rh,rl,rh);
  }
  else {
    tcg_gen_muls2_i32_aarch64(tcg_ctx_00,rl,rh,rl,rh);
  }
  if (add) {
    bl = load_reg(s,a->ra);
    bh = load_reg(s,a->rd);
    tcg_gen_add2_i32_aarch64(tcg_ctx_00,rl,rh,rl,rh,bl,bh);
    tcg_temp_free_i32(tcg_ctx_00,bl);
    tcg_temp_free_i32(tcg_ctx_00,bh);
  }
  if (a->s != 0) {
    gen_logicq_cc(tcg_ctx_00,rl,rh);
  }
  store_reg(s,a->ra,rl);
  store_reg(s,a->rd,rh);
  return true;
}

Assistant:

static bool op_mlal(DisasContext *s, arg_s_rrrr *a, bool uns, bool add)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t0, t1, t2, t3;

    t0 = load_reg(s, a->rm);
    t1 = load_reg(s, a->rn);
    if (uns) {
        tcg_gen_mulu2_i32(tcg_ctx, t0, t1, t0, t1);
    } else {
        tcg_gen_muls2_i32(tcg_ctx, t0, t1, t0, t1);
    }
    if (add) {
        t2 = load_reg(s, a->ra);
        t3 = load_reg(s, a->rd);
        tcg_gen_add2_i32(tcg_ctx, t0, t1, t0, t1, t2, t3);
        tcg_temp_free_i32(tcg_ctx, t2);
        tcg_temp_free_i32(tcg_ctx, t3);
    }
    if (a->s) {
        gen_logicq_cc(tcg_ctx, t0, t1);
    }
    store_reg(s, a->ra, t0);
    store_reg(s, a->rd, t1);
    return true;
}